

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  string local_40;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  bVar1 = true;
  if (TVar2 != INTERFACE_LIBRARY) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"EXCLUDE_FROM_ALL","");
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmGeneratorTarget* target) const
{
  return target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
    target->GetPropertyAsBool("EXCLUDE_FROM_ALL");
}